

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleGetMultisamplefvTests.cpp
# Opt level: O0

IterateResult __thiscall
glcts::MultisampleTextureGetMultisamplefvInvalidPnameRejectedTest::iterate
          (MultisampleTextureGetMultisamplefvInvalidPnameRejectedTest *this)

{
  int iVar1;
  RenderContext *pRVar2;
  GLfloat extraout_var;
  TestError *this_00;
  undefined1 local_20 [4];
  GLenum error_code;
  GLfloat val [2];
  Functions *gl;
  MultisampleTextureGetMultisamplefvInvalidPnameRejectedTest *this_local;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  val[0] = (GLfloat)(*pRVar2->_vptr_RenderContext[3])();
  val[1] = extraout_var;
  (**(code **)((long)val + 0x8e8))(0x80a9,0,local_20);
  iVar1 = (**(code **)((long)val + 0x800))();
  if (iVar1 != 0x500) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid error code reported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGetMultisamplefvTests.cpp"
               ,0x9d);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult MultisampleTextureGetMultisamplefvInvalidPnameRejectedTest::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Issue call with valid parameters, but invalid pname GL_SAMPLES */
	glw::GLfloat val[2];
	gl.getMultisamplefv(GL_SAMPLES, 0, val);

	/* Check if the expected error code was reported */
	glw::GLenum error_code = gl.getError();

	if (error_code != GL_INVALID_ENUM)
	{
		TCU_FAIL("Invalid error code reported");
	}

	/* Test case passed */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}